

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_parseSettingsLine
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,char *line,int lineNumber)

{
  byte *__s1;
  byte bVar1;
  bool bVar2;
  int iVar3;
  SPxOut *pSVar4;
  long lVar5;
  unsigned_long uVar6;
  ulong uVar7;
  Verbosity old_verbosity_6;
  char *pcVar8;
  Verbosity old_verbosity_4;
  byte *pbVar9;
  long lVar10;
  byte *pbVar11;
  undefined8 *puVar12;
  Verbosity old_verbosity;
  Verbosity VVar13;
  byte *__s1_00;
  byte *pbVar14;
  Verbosity old_verbosity_8;
  byte *__s1_01;
  allocator local_59;
  string local_58;
  Real local_38;
  
  for (pbVar11 = (byte *)(line + 1); uVar7 = (ulong)pbVar11[-1], uVar7 < 0x24; pbVar11 = pbVar11 + 1
      ) {
    if ((0x100002200U >> (uVar7 & 0x3f) & 1) == 0) {
      if ((0x800000401U >> (uVar7 & 0x3f) & 1) != 0) {
        return true;
      }
      break;
    }
  }
  __s1 = pbVar11 + -1;
  __s1_00 = pbVar11;
  while (0x3a < (byte)uVar7) {
LAB_0045d7ad:
    bVar1 = *__s1_00;
    __s1_00 = __s1_00 + 1;
    uVar7 = (ulong)bVar1;
  }
  if ((0x900002601U >> (uVar7 & 0x3f) & 1) == 0) {
    if (uVar7 != 0x3a) goto LAB_0045d7ad;
    __s1_00[-1] = 0;
  }
  else {
    __s1_00[-1] = 0;
    pbVar14 = __s1_00;
    do {
      do {
        __s1_00 = pbVar14 + 1;
        bVar1 = *pbVar14;
        pbVar14 = __s1_00;
      } while (bVar1 == 9);
    } while ((bVar1 == 0xd) || (bVar1 == 0x20));
    if (bVar1 != 0x3a) {
      VVar13 = (this->spxout).m_verbosity;
      if ((int)VVar13 < 3) {
        return false;
      }
      pSVar4 = &this->spxout;
      (this->spxout).m_verbosity = INFO1;
      pcVar8 = "Error parsing settings file: no \':\' separating parameter type and name in line ";
      goto LAB_0045d830;
    }
  }
  for (; uVar7 = (ulong)*__s1_00, pbVar14 = __s1_00, uVar7 < 0x24; __s1_00 = __s1_00 + 1) {
    if ((0x100002200U >> (uVar7 & 0x3f) & 1) == 0) {
      if ((0x800000401U >> (uVar7 & 0x3f) & 1) != 0) {
        VVar13 = (this->spxout).m_verbosity;
        if ((int)VVar13 < 3) {
          return false;
        }
        pSVar4 = &this->spxout;
        (this->spxout).m_verbosity = INFO1;
        pcVar8 = "Error parsing settings file: no parameter name in line ";
        goto LAB_0045d830;
      }
      break;
    }
  }
LAB_0045d867:
  __s1_01 = pbVar14 + 1;
  if (0x3d < (byte)uVar7) goto LAB_0045d87d;
  if ((0x900002601U >> (uVar7 & 0x3f) & 1) == 0) {
    if (uVar7 != 0x3d) goto LAB_0045d87d;
    *pbVar14 = 0;
  }
  else {
    *pbVar14 = 0;
    pbVar14 = __s1_01;
    do {
      do {
        __s1_01 = pbVar14 + 1;
        bVar1 = *pbVar14;
        pbVar14 = __s1_01;
      } while (bVar1 == 9);
    } while ((bVar1 == 0xd) || (bVar1 == 0x20));
    if (bVar1 != 0x3d) {
      VVar13 = (this->spxout).m_verbosity;
      if ((int)VVar13 < 3) {
        return false;
      }
      pSVar4 = &this->spxout;
      (this->spxout).m_verbosity = INFO1;
      pcVar8 = "Error parsing settings file: no \'=\' after parameter name in line ";
      goto LAB_0045d830;
    }
  }
  goto LAB_0045d8d1;
LAB_0045d87d:
  uVar7 = (ulong)*__s1_01;
  pbVar14 = __s1_01;
  goto LAB_0045d867;
LAB_0045d8d1:
  uVar7 = (ulong)*__s1_01;
  pbVar14 = __s1_01;
  if (0x23 < uVar7) goto LAB_0045d91a;
  if ((0x100002200U >> (uVar7 & 0x3f) & 1) == 0) {
    if ((0x800000401U >> (uVar7 & 0x3f) & 1) != 0) {
      VVar13 = (this->spxout).m_verbosity;
      if ((int)VVar13 < 3) {
        return false;
      }
      pSVar4 = &this->spxout;
      (this->spxout).m_verbosity = INFO1;
      pcVar8 = "Error parsing settings file: no parameter value in line ";
      goto LAB_0045d830;
    }
    goto LAB_0045d91a;
  }
  __s1_01 = __s1_01 + 1;
  goto LAB_0045d8d1;
LAB_0045d91a:
  pbVar9 = pbVar14 + 1;
  if ((byte)uVar7 < 0x24) {
    if ((0x900002600U >> (uVar7 & 0x3f) & 1) != 0) {
      *pbVar14 = 0;
      goto LAB_0045d93c;
    }
    if (uVar7 == 0) goto LAB_0045d960;
  }
  uVar7 = (ulong)*pbVar9;
  pbVar14 = pbVar9;
  goto LAB_0045d91a;
LAB_0045d93c:
  uVar7 = (ulong)*pbVar9;
  if (0x23 < uVar7) {
LAB_0045da6e:
    VVar13 = (this->spxout).m_verbosity;
    if ((int)VVar13 < 3) {
      return false;
    }
    (this->spxout).m_verbosity = INFO1;
    pSVar4 = soplex::operator<<(&this->spxout,"Error parsing settings file: additional character \'"
                               );
    pSVar4 = soplex::operator<<(pSVar4,*pbVar9);
    pcVar8 = "\' after parameter value in line ";
LAB_0045d830:
    pSVar4 = soplex::operator<<(pSVar4,pcVar8);
    pSVar4 = soplex::operator<<(pSVar4,lineNumber);
    soplex::operator<<(pSVar4,".\n");
    (this->spxout).m_verbosity = VVar13;
    return false;
  }
  if ((0x100002200U >> (uVar7 & 0x3f) & 1) == 0) {
    if ((0x800000401U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_0045d960;
    goto LAB_0045da6e;
  }
  pbVar9 = pbVar9 + 1;
  goto LAB_0045d93c;
LAB_0045d960:
  iVar3 = strncmp((char *)__s1,"bool",4);
  if (iVar3 == 0) {
    puVar12 = &SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               ::Settings::boolParam;
    for (lVar10 = 0; lVar10 != 0x1a; lVar10 = lVar10 + 1) {
      iVar3 = strncmp((char *)__s1_00,(char *)*puVar12,500);
      if (iVar3 == 0) {
        iVar3 = strncasecmp((char *)__s1_01,"true",4);
        if ((((iVar3 == 0) || (iVar3 = strncasecmp((char *)__s1_01,"TRUE",4), iVar3 == 0)) ||
            (iVar3 = strncasecmp((char *)__s1_01,"t",4), iVar3 == 0)) ||
           ((iVar3 = strncasecmp((char *)__s1_01,"T",4), iVar3 == 0 ||
            (lVar5 = strtol((char *)__s1_01,(char **)0x0,4), lVar5 == 1)))) {
          bVar2 = true;
LAB_0045dbbc:
          bVar2 = setBoolParam(this,(BoolParam)lVar10,bVar2,true);
          if (bVar2) {
            return true;
          }
        }
        else {
          iVar3 = strncasecmp((char *)__s1_01,"false",5);
          if (((iVar3 == 0) || (iVar3 = strncasecmp((char *)__s1_01,"FALSE",5), iVar3 == 0)) ||
             ((iVar3 = strncasecmp((char *)__s1_01,"f",5), iVar3 == 0 ||
              ((iVar3 = strncasecmp((char *)__s1_01,"F",5), iVar3 == 0 ||
               (lVar5 = strtol((char *)__s1_01,(char **)0x0,5), lVar5 == 0)))))) {
            bVar2 = false;
            goto LAB_0045dbbc;
          }
        }
        VVar13 = (this->spxout).m_verbosity;
        if ((int)VVar13 < 3) {
          return false;
        }
        (this->spxout).m_verbosity = INFO1;
        pSVar4 = soplex::operator<<(&this->spxout,"Error parsing settings file: invalid value <");
        pSVar4 = soplex::operator<<(pSVar4,(char *)__s1_01);
        pcVar8 = "> for bool parameter <";
        goto LAB_0045ddcc;
      }
      puVar12 = puVar12 + 4;
    }
  }
  else if (((*__s1 == 0x69) && (*pbVar11 == 0x6e)) && (pbVar11[1] == 0x74)) {
    puVar12 = &SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               ::Settings::intParam;
    for (lVar10 = 0; lVar10 != 0x1c; lVar10 = lVar10 + 1) {
      iVar3 = strncmp((char *)__s1_00,(char *)*puVar12,500);
      if (iVar3 == 0) {
        std::__cxx11::string::string((string *)&local_58,(char *)__s1_01,&local_59);
        iVar3 = std::__cxx11::stoi(&local_58,(size_t *)0x0,10);
        std::__cxx11::string::~string((string *)&local_58);
        bVar2 = setIntParam(this,(IntParam)lVar10,iVar3,false);
        if (bVar2) {
          return true;
        }
        VVar13 = (this->spxout).m_verbosity;
        if ((int)VVar13 < 3) {
          return false;
        }
        (this->spxout).m_verbosity = INFO1;
        pSVar4 = soplex::operator<<(&this->spxout,"Error parsing settings file: invalid value <");
        pSVar4 = soplex::operator<<(pSVar4,(char *)__s1_01);
        pcVar8 = "> for int parameter <";
        goto LAB_0045ddcc;
      }
      puVar12 = puVar12 + 4;
    }
  }
  else {
    iVar3 = strncmp((char *)__s1,"real",4);
    if (iVar3 != 0) {
      iVar3 = strncmp((char *)__s1,"uint",4);
      if (iVar3 == 0) {
        iVar3 = strncmp((char *)__s1_00,"random_seed",0xb);
        if (iVar3 == 0) {
          std::__cxx11::string::string((string *)&local_58,(char *)__s1_01,&local_59);
          uVar6 = std::__cxx11::stoul(&local_58,(size_t *)0x0,10);
          std::__cxx11::string::~string((string *)&local_58);
          if (uVar6 >> 0x20 != 0) {
            VVar13 = (this->spxout).m_verbosity;
            uVar6 = 0xffffffffffffffff;
            if (0 < (int)VVar13) {
              (this->spxout).m_verbosity = WARNING;
              soplex::operator<<(&this->spxout,"Converting number greater than UINT_MAX to uint.\n")
              ;
              (this->spxout).m_verbosity = VVar13;
            }
          }
          Random::setSeed(&(this->_solver).random,(uint32_t)uVar6);
          return true;
        }
        VVar13 = (this->spxout).m_verbosity;
        if ((int)VVar13 < 3) {
          return false;
        }
        (this->spxout).m_verbosity = INFO1;
        soplex::operator<<(&this->spxout,
                           "Error parsing settings file for uint parameter <random_seed>.\n");
        (this->spxout).m_verbosity = VVar13;
        return false;
      }
      VVar13 = (this->spxout).m_verbosity;
      if ((int)VVar13 < 3) {
        return false;
      }
      (this->spxout).m_verbosity = INFO1;
      pSVar4 = soplex::operator<<(&this->spxout,
                                  "Error parsing settings file: invalid parameter type <");
      pSVar4 = soplex::operator<<(pSVar4,(char *)__s1);
      pcVar8 = "> for parameter <";
      goto LAB_0045db01;
    }
    puVar12 = &SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               ::Settings::realParam;
    for (lVar10 = 0; lVar10 != 0x1b; lVar10 = lVar10 + 1) {
      iVar3 = strncmp((char *)__s1_00,(char *)*puVar12,500);
      if (iVar3 == 0) {
        std::__cxx11::string::string((string *)&local_58,(char *)__s1_01,&local_59);
        local_38 = std::__cxx11::stod(&local_58,(size_t *)0x0);
        std::__cxx11::string::~string((string *)&local_58);
        bVar2 = setRealParam(this,(RealParam)lVar10,local_38,true);
        if (bVar2) {
          return true;
        }
        VVar13 = (this->spxout).m_verbosity;
        if ((int)VVar13 < 3) {
          return false;
        }
        (this->spxout).m_verbosity = INFO1;
        pSVar4 = soplex::operator<<(&this->spxout,"Error parsing settings file: invalid value <");
        pSVar4 = soplex::operator<<(pSVar4,(char *)__s1_01);
        pcVar8 = "> for R parameter <";
LAB_0045ddcc:
        pSVar4 = soplex::operator<<(pSVar4,pcVar8);
        pSVar4 = soplex::operator<<(pSVar4,(char *)__s1_00);
        pSVar4 = soplex::operator<<(pSVar4,"> in line ");
        pSVar4 = soplex::operator<<(pSVar4,lineNumber);
        soplex::operator<<(pSVar4,".\n");
        (this->spxout).m_verbosity = VVar13;
        return false;
      }
      puVar12 = puVar12 + 4;
    }
  }
  VVar13 = (this->spxout).m_verbosity;
  if ((int)VVar13 < 3) {
    return false;
  }
  pSVar4 = &this->spxout;
  (this->spxout).m_verbosity = INFO1;
  pcVar8 = "Error parsing settings file: unknown parameter name <";
LAB_0045db01:
  pSVar4 = soplex::operator<<(pSVar4,pcVar8);
  pSVar4 = soplex::operator<<(pSVar4,(char *)__s1_00);
  pSVar4 = soplex::operator<<(pSVar4,"> in line ");
  pSVar4 = soplex::operator<<(pSVar4,lineNumber);
  soplex::operator<<(pSVar4,".\n");
  (this->spxout).m_verbosity = VVar13;
  return false;
}

Assistant:

bool SoPlexBase<R>::_parseSettingsLine(char* line, const int lineNumber)
{
   assert(line != nullptr);

   bool success = true;

   // find the start of the parameter type
   while(*line == ' ' || *line == '\t' || *line == '\r')
      line++;

   if(*line == '\0' || *line == '\n' || *line == '#')
      return true;

   char* paramTypeString = line;

   // find the end of the parameter type
   while(*line != ' ' && *line != '\t' && *line != '\r' && *line != '\n' && *line != '#'
         && *line != '\0' && *line != ':')
      line++;

   if(*line == ':')
   {
      *line = '\0';
      line++;
   }
   else
   {
      *line = '\0';
      line++;

      // search for the ':' char in the line
      while(*line == ' ' || *line == '\t' || *line == '\r')
         line++;

      if(*line != ':')
      {
         SPX_MSG_INFO1(spxout, spxout <<
                       "Error parsing settings file: no ':' separating parameter type and name in line " << lineNumber <<
                       ".\n");
         return false;
      }

      line++;
   }

   // find the start of the parameter name
   while(*line == ' ' || *line == '\t' || *line == '\r')
      line++;

   if(*line == '\0' || *line == '\n' || *line == '#')
   {
      SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: no parameter name in line " <<
                    lineNumber << ".\n");
      return false;
   }

   char* paramName = line;

   // find the end of the parameter name
   while(*line != ' ' && *line != '\t' && *line != '\r' && *line != '\n' && *line != '#'
         && *line != '\0' && *line != '=')
      line++;

   if(*line == '=')
   {
      *line = '\0';
      line++;
   }
   else
   {
      *line = '\0';
      line++;

      // search for the '=' char in the line
      while(*line == ' ' || *line == '\t' || *line == '\r')
         line++;

      if(*line != '=')
      {
         SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: no '=' after parameter name in line "
                       << lineNumber << ".\n");
         return false;
      }

      line++;
   }

   // find the start of the parameter value string
   while(*line == ' ' || *line == '\t' || *line == '\r')
      line++;

   if(*line == '\0' || *line == '\n' || *line == '#')
   {
      SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: no parameter value in line " <<
                    lineNumber << ".\n");
      return false;
   }

   char* paramValueString = line;

   // find the end of the parameter value string
   while(*line != ' ' && *line != '\t' && *line != '\r' && *line != '\n' && *line != '#'
         && *line != '\0')
      line++;

   if(*line != '\0')
   {
      // check, if the rest of the line is clean
      *line = '\0';
      line++;

      while(*line == ' ' || *line == '\t' || *line == '\r')
         line++;

      if(*line != '\0' && *line != '\n' && *line != '#')
      {
         SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: additional character '" << *line <<
                       "' after parameter value in line " << lineNumber << ".\n");
         return false;
      }
   }

   // check whether we have a bool parameter
   if(strncmp(paramTypeString, "bool", 4) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::BOOLPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: unknown parameter name <" << paramName
                          << "> in line " << lineNumber << ".\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->boolParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            if(strncasecmp(paramValueString, "true", 4) == 0
                  || strncasecmp(paramValueString, "TRUE", 4) == 0
                  || strncasecmp(paramValueString, "t", 4) == 0
                  || strncasecmp(paramValueString, "T", 4) == 0
                  || strtol(paramValueString, nullptr, 4) == 1)
               success = setBoolParam((SoPlexBase<R>::BoolParam)param, true);
            else if(strncasecmp(paramValueString, "false", 5) == 0
                    || strncasecmp(paramValueString, "FALSE", 5) == 0
                    || strncasecmp(paramValueString, "f", 5) == 0
                    || strncasecmp(paramValueString, "F", 5) == 0
                    || strtol(paramValueString, nullptr, 5) == 0)
               success = setBoolParam((SoPlexBase<R>::BoolParam)param, false);
            else
               success = false;

            if(success)
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: invalid value <" << paramValueString
                             << "> for bool parameter <" << paramName << "> in line " << lineNumber << ".\n");
               return false;
            }
         }
      }

      return true;
   }

   // check whether we have an integer parameter
   if(strncmp(paramTypeString, "int", 3) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::INTPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: unknown parameter name <" << paramName
                          << "> in line " << lineNumber << ".\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->intParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            int value;
            value = std::stoi(paramValueString);

            if(setIntParam((SoPlexBase<R>::IntParam)param, value, false))
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: invalid value <" << paramValueString
                             << "> for int parameter <" << paramName << "> in line " << lineNumber << ".\n");
               return false;
            }
         }
      }

      return true;
   }

   // check whether we have a R parameter
   if(strncmp(paramTypeString, "real", 4) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::REALPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: unknown parameter name <" << paramName
                          << "> in line " << lineNumber << ".\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->realParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            Real value;

#ifdef WITH_LONG_DOUBLE
            value = std::stold(paramValueString);
#else
#ifdef WITH_FLOAT
            value = std::stof(paramValueString);
#else
            value = std::stod(paramValueString);
#endif
#endif

            if(setRealParam((SoPlexBase<R>::RealParam)param, value))
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: invalid value <" << paramValueString
                             << "> for R parameter <" << paramName << "> in line " << lineNumber << ".\n");
               return false;
            }
         }
      }

      return true;
   }

#ifdef SOPLEX_WITH_RATIONALPARAM

   // check whether we have a rational parameter
   if(strncmp(paramTypeString, "rational", 8) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::RATIONALPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: unknown parameter name <" << paramName
                          << "> in line " << lineNumber << ".\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->rationalParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            Rational value;

            if(readStringRational(paramValueString, value)
                  && setRationalParam((SoPlexBase<R>::RationalParam)param, value))
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: invalid value <" << paramValueString
                             << "> for rational parameter <" << paramName << "> in line " << lineNumber << ".\n");
               return false;
            }
         }
      }

      return true;
   }

#endif

   // check whether we have the random seed
   if(strncmp(paramTypeString, "uint", 4) == 0)
   {
      if(strncmp(paramName, "random_seed", 11) == 0)
      {
         unsigned int value;
         unsigned long parseval;

         parseval = std::stoul(paramValueString);

         if(parseval > UINT_MAX)
         {
            value = UINT_MAX;
            SPX_MSG_WARNING(spxout, spxout << "Converting number greater than UINT_MAX to uint.\n");
         }
         else
            value = (unsigned int) parseval;

         setRandomSeed(value);
         return true;
      }

      SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file for uint parameter <random_seed>.\n");
      return false;
   }

   SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: invalid parameter type <" <<
                 paramTypeString << "> for parameter <" << paramName << "> in line " << lineNumber << ".\n");

   return false;
}